

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * unixNextSystemCall(sqlite3_vfs *p,char *zName)

{
  sqlite3_syscall_ptr *pp_Var1;
  int iVar2;
  long lVar3;
  sqlite3_syscall_ptr *pp_Var4;
  long lVar5;
  unix_syscall *puVar6;
  
  if (zName == (char *)0x0) {
    lVar5 = -1;
  }
  else {
    puVar6 = aSyscall;
    lVar5 = 0;
    do {
      iVar2 = strcmp(zName,puVar6->zName);
      if (iVar2 == 0) goto LAB_00117ab8;
      lVar5 = lVar5 + 1;
      puVar6 = puVar6 + 1;
    } while (lVar5 != 0x1c);
    lVar5 = 0x1c;
LAB_00117ab8:
    lVar5 = (long)(int)lVar5;
  }
  lVar3 = lVar5 + -0x1d;
  pp_Var1 = &aSyscall[lVar5 + 1].pCurrent;
  do {
    pp_Var4 = pp_Var1;
    lVar3 = lVar3 + 1;
    if (lVar3 == 0) {
      return (char *)0x0;
    }
    pp_Var1 = pp_Var4 + 3;
  } while (*pp_Var4 == (sqlite3_syscall_ptr)0x0);
  return ((unix_syscall *)(pp_Var4 + -1))->zName;
}

Assistant:

static const char *unixNextSystemCall(sqlite3_vfs *p, const char *zName){
  int i = -1;

  UNUSED_PARAMETER(p);
  if( zName ){
    for(i=0; i<ArraySize(aSyscall)-1; i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ) break;
    }
  }
  for(i++; i<ArraySize(aSyscall); i++){
    if( aSyscall[i].pCurrent!=0 ) return aSyscall[i].zName;
  }
  return 0;
}